

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  BCWriteCtx *in_RDX;
  BCWriteCtx *ctx;
  BCWriteCtx *in_stack_00000020;
  BCWriteCtx *ctx_00;
  
  ctx_00 = in_RDX;
  if ((in_RDX->sb).e.ptr32 - (in_RDX->sb).b.ptr32 < 0x400) {
    lj_buf_need2(&in_RDX->sb,(MSize)((ulong)in_RDX >> 0x20));
  }
  bcwrite_header(ctx_00);
  bcwrite_proto(in_stack_00000020,(GCproto *)L);
  bcwrite_footer(in_RDX);
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(L); UNUSED(dummy);
  lj_buf_need(&ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}